

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_show_all_books_in_churches.hpp
# Opt level: O1

void __thiscall
PatchShowAllBooksInChurches::inject_code(PatchShowAllBooksInChurches *this,ROM *rom,World *world)

{
  _func_int **pp_Var1;
  ROM *this_00;
  uint32_t uVar2;
  Code *pCVar3;
  pointer puVar4;
  char *__end;
  initializer_list<unsigned_short> __l;
  vector<unsigned_short,_std::allocator<unsigned_short>_> maps_to_check;
  Code func;
  Param local_158;
  uint32_t local_150;
  undefined4 local_14c;
  undefined1 local_148 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_100;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_c8;
  ROM *local_b0;
  Code local_a8;
  
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x265025f025501a5;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2ed02e002d102bb;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_a8._bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_,0x1880131);
  __l._M_len = 10;
  __l._M_array = (iterator)&local_a8;
  local_b0 = rom;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_c8,__l,(allocator_type *)local_148);
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x200ff1204;
  local_150 = CONCAT31(local_150._1_3_,2);
  local_158._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::move(&local_a8,(Param *)local_148,&local_158,WORD);
  if (local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar4 = local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_150 = CONCAT31(local_150._1_3_,2);
      local_158._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
      local_148._0_8_ = &PTR_getXn_00261c98;
      local_148._10_2_ = 0;
      local_148._8_2_ = *puVar4;
      local_148._12_4_ = 1;
      md::Code::cmpi(&local_a8,(ImmediateValue *)local_148,&local_158,WORD);
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"special_map","");
      md::Code::beq(&local_a8,(string *)local_148);
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_148[8] = 2;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  md::Code::clr(&local_a8,(Param *)local_148,WORD);
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x20001969a;
  md::Code::jmp(&local_a8,(Param *)local_148);
  this_00 = local_b0;
  pp_Var1 = (_func_int **)(local_148 + 0x10);
  local_148._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"special_map","");
  md::Code::label(&local_a8,(string *)local_148);
  if ((_func_int **)local_148._0_8_ != pp_Var1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  local_148[8] = 2;
  local_148._0_8_ = &PTR_getXn_00261bb0;
  md::Code::clr(&local_a8,(Param *)local_148,WORD);
  local_148._0_8_ = &PTR_getXn_00261cd8;
  local_148._8_8_ = (pointer)0x2000196bc;
  md::Code::jmp(&local_a8,(Param *)local_148);
  local_148._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"");
  uVar2 = md::ROM::inject_code(this_00,&local_a8,(string *)local_148);
  if ((_func_int **)local_148._0_8_ != pp_Var1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_130._M_impl.super__Rb_tree_header._M_header;
  _Stack_100._M_impl._0_8_ = 0;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._16_8_ = 0;
  _Stack_130._M_impl._0_8_ = 0;
  local_148._0_8_ = (_func_int **)0x0;
  local_148._8_8_ = (pointer)0x0;
  _Stack_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_100._M_impl.super__Rb_tree_header._M_header;
  _Stack_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_14c = 2;
  local_150 = uVar2;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_130._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_100._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_100._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar3 = md::Code::jmp((Code *)local_148,&local_158);
  pCVar3 = md::Code::nop(pCVar3,3);
  md::ROM::set_code(this_00,0x1968e,pCVar3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_100);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_130);
  if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (ushort *)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        std::vector<uint16_t> maps_to_check = {
                MAP_STAIRWAY_TO_NOLE,
                MAP_MASSAN_CHURCH, MAP_GUMI_CHURCH, MAP_RYUMA_CHURCH, MAP_MERCATOR_CHURCH,
                MAP_VERLA_CHURCH, MAP_DESTEL_CHURCH, MAP_KAZALT_CHURCH,
                MAP_LAKE_SHRINE_SAVE_ROOM, MAP_KN_LABYRINTH_SAVE_ROOM
        };

        constexpr uint32_t JUMP_ADDR_SKIP_ITEM_REMOVAL = 0x196BC;
        constexpr uint32_t JUMP_ADDR_DO_ITEM_REMOVAL = 0x1969A;

        md::Code func;
        func.movew(addr_(0xFF1204), reg_D2);
        for(uint16_t map_id : maps_to_check)
        {
            func.cmpiw(map_id, reg_D2);
            func.beq("special_map");
        }
        func.clrw(reg_D2);
        func.jmp(JUMP_ADDR_DO_ITEM_REMOVAL); // Regular map, do the item removal as usual

        func.label("special_map");
        func.clrw(reg_D2);
        func.jmp(JUMP_ADDR_SKIP_ITEM_REMOVAL); // Special map, do not perform the item removal

        uint32_t func_addr = rom.inject_code(func);
        rom.set_code(0x1968E, md::Code().jmp(func_addr).nop(3));
    }